

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

void __thiscall
boost::deflate::deflate_stream_test::testFlushAtLiteralBufferFull(boost::deflate::
deflate_stream_test::ICompressor&)::fixture::fixture(boost::deflate::deflate_stream_test::
ICompressor&,unsigned_long,boost::deflate::Strategy_(void *this,ICompressor *c,size_t n,Strategy s)

{
  iterator __first;
  iterator __last;
  pointer pvVar1;
  size_type sVar2;
  undefined8 uVar3;
  Strategy s_local;
  size_t n_local;
  ICompressor *c_local;
  fixture *this_local;
  
  *(ICompressor **)this = c;
  std::__cxx11::string::string((string *)((long)this + 0x108));
  (*c->_vptr_ICompressor[1])(c,8,0xf,1,(ulong)s);
  __first = std::array<unsigned_char,_255UL>::begin((array<unsigned_char,_255UL> *)((long)this + 8))
  ;
  __last = std::array<unsigned_char,_255UL>::end((array<unsigned_char,_255UL> *)((long)this + 8));
  std::iota<unsigned_char*,unsigned_char>(__first,__last,'\0');
  std::__cxx11::string::resize((long)this + 0x108);
  pvVar1 = std::array<unsigned_char,_255UL>::data((array<unsigned_char,_255UL> *)((long)this + 8));
  (*c->_vptr_ICompressor[5])(c,pvVar1);
  sVar2 = std::array<unsigned_char,_255UL>::size((array<unsigned_char,_255UL> *)((long)this + 8));
  (*c->_vptr_ICompressor[3])(c,sVar2);
  uVar3 = std::__cxx11::string::front();
  (*c->_vptr_ICompressor[9])(c,uVar3);
  uVar3 = std::__cxx11::string::size();
  (*c->_vptr_ICompressor[7])(c,uVar3);
  return;
}

Assistant:

explicit fixture(ICompressor&c, std::size_t n, Strategy s) : c(c)
            {
                c.init(8, 15, 1, static_cast<int>(s));
                std::iota(in.begin(), in.end(), std::uint8_t{0});
                out.resize(n);
                c.next_in(in.data());
                c.avail_in(in.size());
                c.next_out(&out.front());
                c.avail_out(out.size());
            }